

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall CImage::Save(CImage *this,char *szFilename)

{
  char *__s1;
  char *szExt;
  int nNotTGA;
  int nRes;
  char *szFilename_local;
  CImage *this_local;
  
  szExt._4_4_ = 0;
  szExt._0_4_ = 1;
  if (szFilename == (char *)0x0) {
    szExt._4_4_ = 0x3d;
  }
  else {
    __s1 = strrchr(szFilename,0x2e);
    if (__s1 != (char *)0x0) {
      szExt._0_4_ = strcasecmp(__s1,".tga");
    }
    if ((int)szExt == 0) {
      if (this->m_BitPerPixel == 0x10) {
        szExt._4_4_ = ConvertTo24(this);
      }
      if (szExt._4_4_ == 0) {
        szExt._4_4_ = SaveTga(this,szFilename,true);
      }
    }
    else {
      if ((this->m_BitPerPixel == 0x10) || (this->m_BitPerPixel == 0x20)) {
        szExt._4_4_ = ConvertTo24(this);
      }
      if (szExt._4_4_ == 0) {
        szExt._4_4_ = SaveBmp(this,szFilename);
      }
    }
  }
  return szExt._4_4_;
}

Assistant:

int DLL CImage::Save(char *szFilename)
{
  int nRes = 0;
  int nNotTGA = 1;

  if ( szFilename != NULL ) 
  {
    char * szExt = strrchr( szFilename, '.' );

    if ( szExt != NULL ) 
      nNotTGA = _stricmp( szExt, ".tga" );

    if ( nNotTGA != 0 )
    {
      if (( m_BitPerPixel == 16 ) || ( m_BitPerPixel == 32 ))
        nRes = ConvertTo24();

      if (nRes == 0)
        nRes = SaveBmp( szFilename );
    }
    else
    {
      if ( m_BitPerPixel == 16 )
        nRes = ConvertTo24();

      if (nRes == 0)
        nRes = SaveTga( szFilename, true );
    }
  }
  else
    nRes = eSaveFilename;

  return nRes;
}